

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O3

void Io_WriteAiger_old(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols,int fCompact)

{
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  uint uVar6;
  FILE *__stream;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *vLits;
  Vec_Str_t *__ptr;
  void *pvVar8;
  ProgressBar *p;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  int *piVar14;
  byte *pbVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  char *__format;
  size_t __size;
  int iVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  int local_40;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                  ,0x118,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
  }
  lVar11 = (long)pNtk->vBoxes->nSize;
  if (0 < lVar11) {
    lVar18 = 0;
    do {
      pvVar8 = pNtk->vBoxes->pArray[lVar18];
      if (((*(uint *)((long)pvVar8 + 0x14) & 0xf) == 8) && (*(long *)((long)pvVar8 + 0x38) != 1)) {
        if (fCompact != 0) {
          fwrite("Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n"
                 ,0x55,1,_stdout);
          return;
        }
        bVar22 = false;
        goto LAB_00338d8b;
      }
      lVar18 = lVar18 + 1;
    } while (lVar11 != lVar18);
  }
  bVar22 = pNtk->nConstrs == 0;
LAB_00338d8b:
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_6).pTemp = (void *)0x0;
  pVVar9 = pNtk->vCis;
  if (pVVar9->nSize < 1) {
    uVar21 = 1;
  }
  else {
    uVar16 = 1;
    do {
      *(ulong *)((long)pVVar9->pArray[uVar16 - 1] + 0x40) = uVar16;
      uVar21 = uVar16 + 1;
      pVVar9 = pNtk->vCis;
      bVar5 = (long)uVar16 < (long)pVVar9->nSize;
      uVar16 = uVar21;
    } while (bVar5);
  }
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      puVar2 = (undefined8 *)pVVar9->pArray[lVar11];
      if (puVar2 != (undefined8 *)0x0) {
        if (((ulong)puVar2 & 1) != 0) goto LAB_003394de;
        if (*(int *)*puVar2 != 3) goto LAB_003394d5;
        if (*(int *)((long)puVar2 + 0x1c) == 2) {
          uVar16 = uVar21 & 0xffffffff;
          uVar21 = (ulong)((int)uVar21 + 1);
          puVar2[8] = uVar16;
          pVVar9 = pNtk->vObjs;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  pcVar13 = "2";
  if (fCompact == 0) {
    pcVar13 = "";
  }
  uVar10 = pNtk->vPis->nSize;
  uVar6 = pNtk->nObjCounts[8];
  uVar12 = pNtk->nObjCounts[7];
  uVar21 = (ulong)(uVar6 + uVar12 + uVar10);
  if (bVar22) {
    fprintf(__stream,"aig%s %u %u %u %u %u",pcVar13,uVar21,(ulong)uVar10,(ulong)uVar6,
            (ulong)(uint)pNtk->vPos->nSize,(ulong)uVar12);
  }
  else {
    fprintf(__stream,"aig%s %u %u %u %u %u",pcVar13,uVar21,(ulong)uVar10,(ulong)uVar6,0,
            (ulong)uVar12);
    fprintf(__stream," %u %u",(ulong)(uint)(pNtk->vPos->nSize - pNtk->nConstrs));
  }
  fputc(10,__stream);
  Abc_NtkInvertConstraints(pNtk);
  if (fCompact == 0) {
    pVVar9 = pNtk->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        plVar4 = (long *)pVVar9->pArray[lVar11];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          lVar18 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
          plVar3 = *(long **)(lVar18 + (long)*(int *)plVar4[4] * 8);
          iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8) + 0x40);
          if (3 < (ulong)plVar4[7]) {
            __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                          ,0x156,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
          }
          uVar21 = (ulong)(((uint)(iVar1 == 0) ^ *(uint *)((long)plVar3 + 0x14) >> 10 & 1) +
                          iVar1 * 2);
          switch(plVar4[7]) {
          default:
            fprintf(__stream,"%u %u\n",uVar21,
                    (ulong)(uint)(*(int *)(*(long *)(lVar18 + (long)*(int *)plVar4[6] * 8) + 0x40) *
                                 2));
            goto LAB_0033908f;
          case 1:
            pcVar13 = "%u\n";
            break;
          case 2:
            pcVar13 = "%u 1\n";
          }
          fprintf(__stream,pcVar13,uVar21);
        }
LAB_0033908f:
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->vBoxes;
      } while (lVar11 < pVVar9->nSize);
    }
    pVVar9 = pNtk->vPos;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        plVar4 = (long *)pVVar9->pArray[lVar11];
        iVar1 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                  (long)*(int *)plVar4[4] * 8) + 0x40);
        fprintf(__stream,"%u\n",
                (ulong)(((uint)(iVar1 == 0) ^ *(uint *)((long)plVar4 + 0x14) >> 10 & 1) + iVar1 * 2)
               );
        lVar11 = lVar11 + 1;
        pVVar9 = pNtk->vPos;
      } while (lVar11 < pVVar9->nSize);
    }
  }
  else {
    vLits = Io_WriteAigerLiterals(pNtk);
    __ptr = Io_WriteEncodeLiterals(vLits);
    pcVar13 = __ptr->pArray;
    fwrite(pcVar13,1,(long)__ptr->nSize,__stream);
    if (pcVar13 != (char *)0x0) {
      free(pcVar13);
    }
    free(__ptr);
    if (vLits->pArray != (int *)0x0) {
      free(vLits->pArray);
    }
    free(vLits);
  }
  Abc_NtkInvertConstraints(pNtk);
  iVar1 = pNtk->nObjCounts[7];
  __size = (long)iVar1 * 6 + 100;
  pvVar8 = malloc(__size);
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  pVVar9 = pNtk->vObjs;
  if (pVVar9->nSize < 1) {
    iVar20 = 0;
  }
  else {
    lVar11 = 0;
    iVar20 = 0;
    do {
      puVar2 = (undefined8 *)pVVar9->pArray[lVar11];
      if (puVar2 != (undefined8 *)0x0) {
        if (((ulong)puVar2 & 1) != 0) goto LAB_003394de;
        piVar14 = (int *)*puVar2;
        if (*piVar14 != 3) goto LAB_003394d5;
        if (*(int *)((long)puVar2 + 0x1c) == 2) {
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar11)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar11,(char *)0x0);
            piVar14 = (int *)*puVar2;
          }
          uVar10 = (*(uint *)((long)puVar2 + 0x14) >> 10 & 1) +
                   *(int *)(*(long *)(*(long *)(*(long *)(piVar14 + 8) + 8) +
                                     (long)*(int *)puVar2[4] * 8) + 0x40) * 2;
          uVar6 = (*(uint *)((long)puVar2 + 0x14) >> 0xb & 1) +
                  *(int *)(*(long *)(*(long *)(*(long *)(piVar14 + 8) + 8) +
                                    (long)((int *)puVar2[4])[1] * 8) + 0x40) * 2;
          uVar12 = uVar6;
          if (uVar10 < uVar6) {
            uVar12 = uVar10;
          }
          if (uVar6 < uVar10) {
            uVar6 = uVar10;
          }
          uVar10 = *(int *)(puVar2 + 8) * 2 - uVar6;
          if ((uint)(*(int *)(puVar2 + 8) * 2) < uVar6 || uVar10 == 0) {
            __assert_fail("uLit1 < uLit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                          ,0x17c,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
          }
          if (0x7f < uVar10) {
            pbVar15 = (byte *)((long)iVar20 + (long)pvVar8);
            uVar17 = uVar10;
            do {
              *pbVar15 = (byte)uVar17 | 0x80;
              uVar10 = uVar17 >> 7;
              pbVar15 = pbVar15 + 1;
              iVar20 = iVar20 + 1;
              bVar5 = 0x3fff < uVar17;
              uVar17 = uVar10;
            } while (bVar5);
          }
          iVar19 = iVar20 + 1;
          *(char *)((long)pvVar8 + (long)iVar20) = (char)uVar10;
          uVar6 = uVar6 - uVar12;
          if (0x7f < uVar6) {
            pbVar15 = (byte *)((long)iVar19 + (long)pvVar8);
            uVar10 = uVar6;
            do {
              *pbVar15 = (byte)uVar10 | 0x80;
              uVar6 = uVar10 >> 7;
              pbVar15 = pbVar15 + 1;
              iVar19 = iVar19 + 1;
              bVar5 = 0x3fff < uVar10;
              uVar10 = uVar6;
            } while (bVar5);
          }
          *(char *)((long)pvVar8 + (long)iVar19) = (char)uVar6;
          if (iVar1 * 6 + 0x5a <= iVar19) {
            puts(
                "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
                );
            goto LAB_003394a2;
          }
          iVar20 = iVar19 + 1;
          pVVar9 = pNtk->vObjs;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  local_40 = (int)__size;
  if (local_40 <= iVar20) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteAiger.c"
                  ,0x186,"void Io_WriteAiger_old(Abc_Ntk_t *, char *, int, int)");
  }
  Extra_ProgressBarStop(p);
  fwrite(pvVar8,1,(long)iVar20,__stream);
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  if (fWriteSymbols != 0) {
    pVVar9 = pNtk->vPis;
    if (0 < pVVar9->nSize) {
      uVar21 = 0;
      do {
        pcVar13 = Abc_ObjName((Abc_Obj_t *)pVVar9->pArray[uVar21]);
        fprintf(__stream,"i%d %s\n",uVar21 & 0xffffffff,pcVar13);
        uVar21 = uVar21 + 1;
        pVVar9 = pNtk->vPis;
      } while ((long)uVar21 < (long)pVVar9->nSize);
    }
    pVVar9 = pNtk->vBoxes;
    if (0 < pVVar9->nSize) {
      uVar21 = 0;
      do {
        plVar4 = (long *)pVVar9->pArray[uVar21];
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
          pcVar13 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)plVar4[6] * 8));
          fprintf(__stream,"l%d %s\n",uVar21 & 0xffffffff,pcVar13);
          pVVar9 = pNtk->vBoxes;
        }
        uVar21 = uVar21 + 1;
      } while ((long)uVar21 < (long)pVVar9->nSize);
    }
    pVVar9 = pNtk->vPos;
    uVar21 = (ulong)(uint)pVVar9->nSize;
    if (0 < pVVar9->nSize) {
      uVar16 = 0;
      do {
        pAVar7 = (Abc_Obj_t *)pVVar9->pArray[uVar16];
        if (bVar22) {
          pcVar13 = Abc_ObjName(pAVar7);
          __format = "o%d %s\n";
LAB_003393fb:
          uVar21 = uVar16 & 0xffffffff;
        }
        else {
          iVar1 = pNtk->nConstrs;
          if ((long)uVar16 < (long)((int)uVar21 - iVar1)) {
            pcVar13 = Abc_ObjName(pAVar7);
            __format = "b%d %s\n";
            goto LAB_003393fb;
          }
          pcVar13 = Abc_ObjName(pAVar7);
          __format = "c%d %s\n";
          uVar21 = (ulong)(uint)((iVar1 - (int)uVar21) + (int)uVar16);
        }
        fprintf(__stream,__format,uVar21,pcVar13);
        uVar16 = uVar16 + 1;
        pVVar9 = pNtk->vPos;
        uVar21 = (ulong)pVVar9->nSize;
      } while ((long)uVar16 < (long)uVar21);
    }
  }
  fwrite("c\n",2,1,__stream);
  if ((pNtk->pName != (char *)0x0) && (*pNtk->pName != '\0')) {
    fprintf(__stream,".model %s\n");
  }
  pcVar13 = Extra_TimeStamp();
  fprintf(__stream,"This file was produced by ABC on %s\n",pcVar13);
  fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
LAB_003394a2:
  fclose(__stream);
  return;
LAB_003394de:
  pcVar13 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_003394e5;
LAB_003394d5:
  pcVar13 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_003394e5:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

void Io_WriteAiger_old( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols, int fCompact )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, nBufferSize, Pos, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    fExtended = Abc_NtkConstrNum(pNtk);

    assert( Abc_NtkIsStrash(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( !Abc_LatchIsInit0(pObj) )
        {
            if ( !fCompact )
            {
                fExtended = 1;
                break;
            }
            fprintf( stdout, "Io_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
        Abc_NtkPiNum(pNtk),
        Abc_NtkLatchNum(pNtk),
        fExtended ? 0 : Abc_NtkPoNum(pNtk),
        Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        fprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    fprintf( pFile, "\n" );

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Abc_NtkInvertConstraints( pNtk );
    if ( !fCompact ) 
    {
        // write latch drivers
        Abc_NtkForEachLatch( pNtk, pLatch, i )
        {
            pObj = Abc_ObjFanin0(pLatch);
            pDriver = Abc_ObjFanin0(pObj);
            uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
            if ( Abc_LatchIsInit0(pLatch) )
                fprintf( pFile, "%u\n", uLit );
            else if ( Abc_LatchIsInit1(pLatch) )
                fprintf( pFile, "%u 1\n", uLit );
            else
            {
                // Both None and DC are written as 'uninitialized' e.g. a free boolean value
                assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
                fprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
            }
        }
        // write PO drivers
        Abc_NtkForEachPo( pNtk, pObj, i )
        {
            pDriver = Abc_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Io_WriteAigerLiterals( pNtk );
        Vec_Str_t * vBinary = Io_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit  - uLit1) );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, (unsigned)(uLit1 - uLit0) );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                fprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                fprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    fprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        fprintf( pFile, ".model %s\n", pNtk->pName );
    fprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}